

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<15>::PartialDistribution::PartialDistribution
          (PartialDistribution *this,Probability *probability,Distribution *spectrum)

{
  TabulationRecord::TabulationRecord((TabulationRecord *)this,&probability->super_TabulationRecord);
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>
  ::InterpolationSequenceRecord(&(this->distribution_).data_,&spectrum->data_);
  verifyLF((int)((_Head_base<3UL,_long,_false> *)
                ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata
                        .fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->
                _M_head_impl,1);
  return;
}

Assistant:

PartialDistribution( Probability&& probability,
                     Distribution&& spectrum ) :
  probability_( std::move( probability ) ),
  distribution_( std::move( spectrum ) ) {

  verifyLF( this->probability_.LF(),
            this->distribution_.LF() );
}